

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

void __thiscall BPlusTree::PrintStats(BPlusTree *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  element_type *this_00;
  shared_ptr<Node> local_40 [2];
  shared_ptr<Node> local_20;
  BPlusTree *local_10;
  BPlusTree *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->root,(nullptr_t)0x0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"------------- B+ Tree Statistic --------------")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"B+ tree is empty");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"----------------------------------------------")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"------------- B+ Tree Statistic --------------")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Parmeter N of B+ Tree: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,this->size);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Number of nodes in B+ Tree: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,this->numNodes);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Height of B+ Tree: ");
    iVar2 = GetHeight(this);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Content of root node: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<Node>::shared_ptr(&local_20,&this->root);
    PrintNodeWithoutPtr(this,&local_20);
    std::shared_ptr<Node>::~shared_ptr(&local_20);
    poVar3 = std::operator<<((ostream *)&std::cout,"Content of 1st child node: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_00 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                        );
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
              (&this_00->ptrs,0);
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)local_40);
    PrintNodeWithoutPtr(this,local_40);
    std::shared_ptr<Node>::~shared_ptr(local_40);
    poVar3 = std::operator<<((ostream *)&std::cout,"----------------------------------------------")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void BPlusTree::PrintStats() {
    if (root == nullptr) {
        std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
        std::cout << "B+ tree is empty" << std::endl;
        std::cout << "----------------------------------------------" << std::endl;
        return;
    }
    std::cout << "------------- B+ Tree Statistic --------------" << std::endl;
    std::cout << "Parmeter N of B+ Tree: " << size << std::endl;
    std::cout << "Number of nodes in B+ Tree: " << numNodes << std::endl;
    std::cout << "Height of B+ Tree: " << GetHeight() << std::endl;
    std::cout << "Content of root node: " << std::endl;
    PrintNodeWithoutPtr(root);
    std::cout << "Content of 1st child node: " << std::endl;
    PrintNodeWithoutPtr(std::static_pointer_cast<Node>(root->ptrs[0]));
    std::cout << "----------------------------------------------" << std::endl;
}